

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_fill_random
              (mbedtls_mpi *X,size_t size,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  uchar local_438 [8];
  uchar buf [1024];
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t size_local;
  mbedtls_mpi *X_local;
  
  if (size < 0x401) {
    buf._1020_4_ = (*f_rng)(p_rng,local_438,size);
    if (buf._1020_4_ == 0) {
      buf._1020_4_ = mbedtls_mpi_read_binary(X,local_438,size);
    }
    X_local._4_1_ = buf[0x3fc];
    X_local._5_1_ = buf[0x3fd];
    X_local._6_1_ = buf[0x3fe];
    X_local._7_1_ = buf[0x3ff];
  }
  else {
    X_local._4_4_ = -4;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_fill_random( mbedtls_mpi *X, size_t size,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( size > MBEDTLS_MPI_MAX_SIZE )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( f_rng( p_rng, buf, size ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( X, buf, size ) );

cleanup:
    return( ret );
}